

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O1

vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *
cnn::AllocateShadowLookupParameters
          (vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
           *__return_storage_ptr__,Model *m)

{
  pointer ppLVar1;
  LookupParameters **p;
  pointer ppLVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::reserve
            (__return_storage_ptr__,
             (long)(m->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(m->lookup_params).
                   super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppLVar1 = (m->lookup_params).
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar2 = (m->lookup_params).
                 super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppLVar2 != ppLVar1;
      ppLVar2 = ppLVar2 + 1) {
    std::vector<cnn::ShadowLookupParameters,std::allocator<cnn::ShadowLookupParameters>>::
    emplace_back<cnn::LookupParameters&>
              ((vector<cnn::ShadowLookupParameters,std::allocator<cnn::ShadowLookupParameters>> *)
               __return_storage_ptr__,*ppLVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ShadowLookupParameters> AllocateShadowLookupParameters(const Model& m) {
  vector<ShadowLookupParameters> v;
  v.reserve(m.lookup_parameters_list().size());
  for (auto& p : m.lookup_parameters_list())
    v.emplace_back(*p);
  return v;
}